

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O1

void __thiscall
icu_63::LocaleDisplayNamesImpl::LocaleDisplayNamesImpl
          (LocaleDisplayNamesImpl *this,Locale *locale,UDisplayContext *contexts,int32_t length)

{
  int iVar1;
  uint uVar2;
  UDialectHandling *pUVar3;
  
  (this->super_LocaleDisplayNames).super_UObject._vptr_UObject =
       (_func_int **)&PTR__LocaleDisplayNamesImpl_003dc770;
  Locale::Locale(&this->locale);
  this->dialectHandling = ULDN_STANDARD_NAMES;
  ICUDataTable::ICUDataTable(&this->langData,"icudt63l-lang",locale);
  ICUDataTable::ICUDataTable(&this->regionData,"icudt63l-region",locale);
  UnicodeString::UnicodeString(&(this->separatorFormat).compiledPattern,L'\0');
  UnicodeString::UnicodeString(&(this->format).compiledPattern,L'\0');
  UnicodeString::UnicodeString(&(this->keyTypeFormat).compiledPattern,L'\0');
  this->capitalizationContext = UDISPCTX_CAPITALIZATION_NONE;
  this->capitalizationBrkIter = (BreakIterator *)0x0;
  (this->formatOpenParen).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003e7ab8;
  (this->formatOpenParen).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->formatReplaceOpenParen).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003e7ab8;
  (this->formatReplaceOpenParen).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->formatCloseParen).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003e7ab8;
  (this->formatCloseParen).fUnion.fStackFields.fLengthAndFlags = 2;
  (this->formatReplaceCloseParen).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003e7ab8;
  (this->formatReplaceCloseParen).fUnion.fStackFields.fLengthAndFlags = 2;
  this->nameLength = UDISPCTX_LENGTH_FULL;
  if (0 < length) {
    iVar1 = length + 1;
    do {
      uVar2 = *contexts >> 8;
      pUVar3 = &this->dialectHandling;
      if (((uVar2 == 0) || (pUVar3 = &this->capitalizationContext, uVar2 == 1)) ||
         (pUVar3 = &this->nameLength, uVar2 == 2)) {
        *pUVar3 = *contexts;
      }
      contexts = contexts + 1;
      iVar1 = iVar1 + -1;
    } while (1 < iVar1);
  }
  initialize(this);
  return;
}

Assistant:

LocaleDisplayNamesImpl::LocaleDisplayNamesImpl(const Locale& locale,
                                               UDisplayContext *contexts, int32_t length)
    : dialectHandling(ULDN_STANDARD_NAMES)
    , langData(U_ICUDATA_LANG, locale)
    , regionData(U_ICUDATA_REGION, locale)
    , capitalizationContext(UDISPCTX_CAPITALIZATION_NONE)
    , capitalizationBrkIter(NULL)
    , nameLength(UDISPCTX_LENGTH_FULL)
{
    while (length-- > 0) {
        UDisplayContext value = *contexts++;
        UDisplayContextType selector = (UDisplayContextType)((uint32_t)value >> 8);
        switch (selector) {
            case UDISPCTX_TYPE_DIALECT_HANDLING:
                dialectHandling = (UDialectHandling)value;
                break;
            case UDISPCTX_TYPE_CAPITALIZATION:
                capitalizationContext = value;
                break;
            case UDISPCTX_TYPE_DISPLAY_LENGTH:
                nameLength = value;
                break;
            default:
                break;
        }
    }
    initialize();
}